

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_from_pubkey
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *xonly_pubkey,int *pk_parity,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  undefined1 local_88 [4];
  int tmp;
  secp256k1_ge pk;
  secp256k1_pubkey *pubkey_local;
  int *pk_parity_local;
  secp256k1_xonly_pubkey *xonly_pubkey_local;
  secp256k1_context *ctx_local;
  
  pk._80_8_ = pubkey;
  if (xonly_pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"xonly_pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)local_88,pubkey);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_extrakeys_ge_even_y((secp256k1_ge *)local_88);
      if (pk_parity != (int *)0x0) {
        *pk_parity = iVar1;
      }
      secp256k1_xonly_pubkey_save(xonly_pubkey,(secp256k1_ge *)local_88);
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_xonly_pubkey_from_pubkey(const secp256k1_context* ctx, secp256k1_xonly_pubkey *xonly_pubkey, int *pk_parity, const secp256k1_pubkey *pubkey) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(xonly_pubkey != NULL);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(xonly_pubkey, &pk);
    return 1;
}